

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

bool __thiscall GameBoard::typeCountError(GameBoard *this,int color)

{
  int *piVar1;
  int in_ESI;
  long in_RDI;
  int i;
  int mx;
  int mn;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_10 = 10000000;
  local_14 = -1;
  local_c = in_ESI;
  for (local_18 = 0; local_18 < 7; local_18 = local_18 + 1) {
    piVar1 = std::min<int>(&local_10,
                           (int *)(in_RDI + 0x9ec + (long)local_c * 0x1c + (long)local_18 * 4));
    local_10 = *piVar1;
    piVar1 = std::max<int>(&local_14,
                           (int *)(in_RDI + 0x9ec + (long)local_c * 0x1c + (long)local_18 * 4));
    local_14 = *piVar1;
  }
  return 2 < local_14 - local_10;
}

Assistant:

bool GameBoard::typeCountError(int color)
{
    int mn = 1e7, mx = -1;
    for (int i = 0; i < 7; ++i) {
        mn = min(mn, typeCountForColor[color][i]);
        mx = max(mx, typeCountForColor[color][i]);
    }
    return mx - mn > 2;
}